

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

t_path * __thiscall
xemmai::portable::t_path::operator/(t_path *__return_storage_ptr__,t_path *this,wstring_view a_path)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__str;
  wstring local_40 [32];
  
  std::__cxx11::wstring::wstring(local_40,&this->v_path);
  __str = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
          xemmai::portable::t_path::operator/=((t_path *)local_40,a_path._M_len,a_path._M_str);
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,__str);
  std::__cxx11::wstring::~wstring(local_40);
  return __return_storage_ptr__;
}

Assistant:

t_path operator/(std::wstring_view a_path) const
	{
		return t_path(*this) /= a_path;
	}